

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::DecodeRawTransactionTxIn::DecodeRawTransactionTxIn(DecodeRawTransactionTxIn *this)

{
  JsonClassBase<cfd::api::json::DecodeRawTransactionTxIn> *in_RDI;
  DecodeUnlockingScript *in_stack_ffffffffffffffe0;
  allocator local_9 [9];
  
  core::JsonClassBase<cfd::api::json::DecodeRawTransactionTxIn>::JsonClassBase(in_RDI);
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__DecodeRawTransactionTxIn_0057efb0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x4543b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 7),"",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xb),"",(allocator *)&stack0xffffffffffffffe3);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
  *(undefined4 *)&in_RDI[0xf]._vptr_JsonClassBase = 0;
  DecodeUnlockingScript::DecodeUnlockingScript(in_stack_ffffffffffffffe0);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(in_RDI + 0x1f));
  *(undefined4 *)&in_RDI[0x23]._vptr_JsonClassBase = 0;
  CollectFieldName();
  return;
}

Assistant:

DecodeRawTransactionTxIn() {
    CollectFieldName();
  }